

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,TextureMap *textures,string *propName,
          aiTextureType target,MeshGeometry *mesh)

{
  Texture *tex;
  PropertyTable *this_00;
  pointer ppaVar1;
  int iVar2;
  const_iterator cVar3;
  Property *pPVar4;
  long lVar5;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var6;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar7;
  long *plVar8;
  MeshGeometry *this_01;
  MatIndexArray *pMVar9;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  _Base_ptr p_Var11;
  undefined8 *puVar12;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  int uvIndex;
  uint matIndex;
  aiUVTransform uvTrafo;
  aiString path;
  uint local_640;
  aiTextureType local_63c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  aiMaterial *local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  undefined4 local_5cc;
  _Rb_tree_node_base *local_5c8;
  undefined1 local_5c0 [376];
  aiVector2D local_448;
  aiVector2D aStack_440;
  undefined4 local_438;
  aiString local_434;
  
  local_618 = out_mat;
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
          ::find(&textures->_M_t,propName);
  if (((_Rb_tree_header *)cVar3._M_node != &(textures->_M_t)._M_impl.super__Rb_tree_header) &&
     (tex = *(Texture **)(cVar3._M_node + 2), tex != (Texture *)0x0)) {
    GetTexturePath(&local_434,this,tex);
    aiMaterial::AddProperty(local_618,&local_434,"$tex.file",target,0);
    local_438 = 0;
    aStack_440 = tex->uvScaling;
    local_448 = tex->uvTrans;
    aiMaterial::AddBinaryProperty(local_618,&local_448,0x14,"$tex.uvtrafo",target,0,aiPTI_Float);
    this_00 = (tex->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00 == (PropertyTable *)0x0) {
      __assert_fail("props.get()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                    ,0x1f7,"const PropertyTable &Assimp::FBX::Texture::Props() const");
    }
    local_640 = 0;
    local_5c0._0_8_ = local_5c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"UVSet","");
    pPVar4 = PropertyTable::Get(this_00,(string *)local_5c0);
    if ((pPVar4 == (Property *)0x0) ||
       (lVar5 = __dynamic_cast(pPVar4,&Property::typeinfo,
                               &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar5 == 0)) {
      local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
      local_610._M_string_length = 0;
      local_610.field_2._M_local_buf[0] = '\0';
      bVar17 = false;
    }
    else {
      local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
      bVar17 = true;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_610,*(long *)(lVar5 + 8),
                 *(long *)(lVar5 + 0x10) + *(long *)(lVar5 + 8));
    }
    if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
      operator_delete((void *)local_5c0._0_8_);
    }
    if (((bVar17) && (iVar2 = std::__cxx11::string::compare((char *)&local_610), iVar2 != 0)) &&
       (local_610._M_string_length != 0)) {
      ppaVar1 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                        (ppaVar1,(this->materials).
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_618);
      local_5cc = (undefined4)((ulong)((long)_Var6._M_current - (long)ppaVar1) >> 3);
      local_640 = 0xffffffff;
      local_63c = target;
      if (mesh == (MeshGeometry *)0x0) {
        p_Var11 = (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_5c8 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (p_Var11 != local_5c8) {
          do {
            if (*(long *)(p_Var11 + 1) == 0) {
              this_01 = (MeshGeometry *)0x0;
            }
            else {
              this_01 = (MeshGeometry *)
                        __dynamic_cast(*(long *)(p_Var11 + 1),&Geometry::typeinfo,
                                       &MeshGeometry::typeinfo,0);
            }
            uVar16 = local_640;
            if (this_01 != (MeshGeometry *)0x0) {
              pMVar9 = MeshGeometry::GetMaterialIndices(this_01);
              _Var10 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                 ((pMVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (pMVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish,&local_5cc);
              uVar16 = local_640;
              if (_Var10._M_current !=
                  (pMVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                uVar16 = 0xffffffff;
                uVar15 = 0;
                do {
                  pvVar7 = MeshGeometry::GetTextureCoords(this_01,uVar15);
                  if ((pvVar7->
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start ==
                      (pvVar7->
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish) break;
                  MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                            ((string *)local_5c0,this_01,uVar15);
                  if (local_5c0._8_8_ == local_610._M_string_length) {
                    if (local_5c0._8_8_ == 0) {
                      bVar17 = true;
                    }
                    else {
                      iVar2 = bcmp((void *)local_5c0._0_8_,local_610._M_dataplus._M_p,
                                   local_5c0._8_8_);
                      bVar17 = iVar2 == 0;
                    }
                  }
                  else {
                    bVar17 = false;
                  }
                  if (bVar17) {
                    uVar16 = uVar15;
                  }
                  if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
                    operator_delete((void *)local_5c0._0_8_);
                  }
                  bVar18 = 6 < uVar15;
                  uVar15 = uVar15 + 1;
                } while (!(bool)(bVar18 | bVar17));
                paVar14 = &local_638.field_2;
                if (uVar16 == 0xffffffff) {
                  std::operator+(&local_5f0,"did not find UV channel named ",&local_610);
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_5f0);
                  target = local_63c;
                  psVar13 = puVar12 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar13) {
                    local_638.field_2._M_allocated_capacity = *psVar13;
                    local_638.field_2._8_8_ = puVar12[3];
                    local_638._M_dataplus._M_p = (pointer)paVar14;
                  }
                  else {
                    local_638.field_2._M_allocated_capacity = *psVar13;
                    local_638._M_dataplus._M_p = (pointer)*puVar12;
                  }
                  local_638._M_string_length = puVar12[1];
                  *puVar12 = psVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             local_5c0,&local_638);
                  LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
                }
                else {
                  target = local_63c;
                  if (local_640 == 0xffffffff) goto LAB_0017bbc2;
                  std::operator+(&local_5f0,"the UV channel named ",&local_610);
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_5f0);
                  target = local_63c;
                  psVar13 = puVar12 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar13) {
                    local_638.field_2._M_allocated_capacity = *psVar13;
                    local_638.field_2._8_8_ = puVar12[3];
                    local_638._M_dataplus._M_p = (pointer)paVar14;
                  }
                  else {
                    local_638.field_2._M_allocated_capacity = *psVar13;
                    local_638._M_dataplus._M_p = (pointer)*puVar12;
                  }
                  local_638._M_string_length = puVar12[1];
                  *puVar12 = psVar13;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             local_5c0,&local_638);
                  LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
                std::ios_base::~ios_base((ios_base *)(local_5c0 + 0x70));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_638._M_dataplus._M_p != paVar14) {
                  operator_delete(local_638._M_dataplus._M_p);
                }
                uVar16 = local_640;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                  operator_delete(local_5f0._M_dataplus._M_p);
                  uVar16 = local_640;
                }
              }
            }
LAB_0017bbc2:
            local_640 = uVar16;
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while (p_Var11 != local_5c8);
        }
      }
      else {
        uVar15 = 0xffffffff;
        uVar16 = 0;
        do {
          pvVar7 = MeshGeometry::GetTextureCoords(mesh,uVar16);
          if ((pvVar7->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start ==
              (pvVar7->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish) break;
          MeshGeometry::GetTextureCoordChannelName_abi_cxx11_((string *)local_5c0,mesh,uVar16);
          if (local_5c0._8_8_ == local_610._M_string_length) {
            if (local_5c0._8_8_ == 0) {
              bVar17 = true;
            }
            else {
              iVar2 = bcmp((void *)local_5c0._0_8_,local_610._M_dataplus._M_p,local_5c0._8_8_);
              bVar17 = iVar2 == 0;
            }
          }
          else {
            bVar17 = false;
          }
          if (bVar17) {
            uVar15 = uVar16;
          }
          if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
            operator_delete((void *)local_5c0._0_8_);
          }
          bVar18 = uVar16 != 7;
          uVar16 = uVar16 + 1;
        } while (!bVar17 && bVar18);
        target = local_63c;
        if (uVar15 == 0xffffffff) {
          std::operator+(&local_5f0,"did not find UV channel named ",&local_610);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_5f0);
          psVar13 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_638.field_2._M_allocated_capacity = *psVar13;
            local_638.field_2._8_8_ = plVar8[3];
            local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
          }
          else {
            local_638.field_2._M_allocated_capacity = *psVar13;
            local_638._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_638._M_string_length = plVar8[1];
          *plVar8 = (long)psVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5c0,
                     &local_638);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
          std::ios_base::~ios_base((ios_base *)(local_5c0 + 0x70));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
            operator_delete(local_5f0._M_dataplus._M_p);
          }
        }
        if (local_640 == 0xffffffff) {
          local_640 = uVar15;
        }
      }
      if (local_640 == 0xffffffff) {
        std::operator+(&local_5f0,"failed to resolve UV channel ",&local_610);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_5f0);
        psVar13 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_638.field_2._M_allocated_capacity = *psVar13;
          local_638.field_2._8_8_ = puVar12[3];
          local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
        }
        else {
          local_638.field_2._M_allocated_capacity = *psVar13;
          local_638._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_638._M_string_length = puVar12[1];
        *puVar12 = psVar13;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5c0,
                   &local_638);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
        std::ios_base::~ios_base((ios_base *)(local_5c0 + 0x70));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._M_dataplus._M_p != &local_638.field_2) {
          operator_delete(local_638._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
          operator_delete(local_5f0._M_dataplus._M_p);
        }
        local_640 = 0;
      }
    }
    aiMaterial::AddBinaryProperty(local_618,&local_640,4,"$tex.uvwsrc",target,0,aiPTI_Integer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_dataplus._M_p != &local_610.field_2) {
      operator_delete(local_610._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const TextureMap& textures,
                const std::string& propName,
                aiTextureType target, const MeshGeometry* const mesh) {
            TextureMap::const_iterator it = textures.find(propName);
            if (it == textures.end()) {
                return;
            }

            const Texture* const tex = (*it).second;
            if (tex != 0)
            {
                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, 0);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, 0);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));


                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, 0);
            }
        }